

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O3

int64_t decNumberIntegralToInt64(decNumber_conflict *dn,decContext *set)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint16_t *puVar4;
  ulong uVar5;
  long lVar6;
  uint64_t prev;
  
  if ((dn->bits & 0x70) == 0) {
    iVar1 = dn->exponent;
    if (-1 < (long)iVar1) {
      iVar2 = dn->digits;
      if (iVar2 + iVar1 < 0x14) {
        if (iVar2 < 1) {
          uVar5 = 0;
        }
        else {
          puVar4 = dn->lsu;
          lVar6 = 1;
          uVar3 = 0;
          do {
            uVar5 = (ulong)*puVar4 * *(long *)(&DAT_00db06e8 + lVar6 * 8) + uVar3;
            if ((uVar5 < uVar3) || ((long)uVar5 < 0)) goto LAB_00b158d1;
            puVar4 = puVar4 + 1;
            lVar6 = lVar6 + 3;
            uVar3 = uVar5;
          } while (lVar6 <= iVar2);
        }
        uVar3 = DECPOWERS[iVar1] * uVar5;
        if (-1 < (long)uVar3 && uVar5 <= uVar3) {
          if ((char)dn->bits < '\0') {
            return -uVar3;
          }
          return uVar3;
        }
      }
    }
  }
LAB_00b158d1:
  decContextSetStatus(set,0x80);
  return 0;
}

Assistant:

int64_t decNumberIntegralToInt64(const decNumber *dn, decContext *set)
{
    if (decNumberIsSpecial(dn) || (dn->exponent < 0) ||
       (dn->digits + dn->exponent > 19)) {
        goto Invalid;
    } else {
        int64_t d;        /* work */
        const Unit *up;   /* .. */
        uint64_t hi = 0;
        up = dn->lsu;     /* -> lsu */

        for (d = 1; d <= dn->digits; up++, d += DECDPUN) {
            uint64_t prev = hi;
            hi += *up * powers[d-1];
            if ((hi < prev) || (hi > INT64_MAX)) {
                goto Invalid;
            }
        }

        uint64_t prev = hi;
        hi *= (uint64_t)powers[dn->exponent];
        if ((hi < prev) || (hi > INT64_MAX)) {
            goto Invalid;
        }
        return (decNumberIsNegative(dn)) ? -((int64_t)hi) : (int64_t)hi;
    }

Invalid:
    decContextSetStatus(set, DEC_Invalid_operation);
    return 0;
}